

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall
Json::ValueIteratorBase::name_abi_cxx11_(string *__return_storage_ptr__,ValueIteratorBase *this)

{
  char *__beg;
  allocator<char> local_29;
  char *local_28;
  char *end;
  char *keey;
  ValueIteratorBase *this_local;
  
  keey = (char *)this;
  this_local = (ValueIteratorBase *)__return_storage_ptr__;
  __beg = memberName(this,&local_28);
  end = __beg;
  if (__beg == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,local_28,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING ValueIteratorBase::name() const {
  char const* keey;
  char const* end;
  keey = memberName(&end);
  if (!keey) return JSONCPP_STRING();
  return JSONCPP_STRING(keey, end);
}